

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_246d29::BuildEngineImpl::finishScanRequest
          (BuildEngineImpl *this,RuleInfo *inputRuleInfo,StateKind newState)

{
  RuleInfo *pRVar1;
  pointer pTVar2;
  _Map_pointer ppTVar3;
  pointer pRVar4;
  TaskInfo *pTVar5;
  uintptr_t uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined5 uVar10;
  RuleScanRecord *pRVar11;
  size_type sVar12;
  TaskInputRequest *pTVar13;
  _Elt_pointer pTVar14;
  pointer pTVar15;
  RuleInfo *__nodes_to_add;
  RuleScanRequest *request;
  RuleInfo *pRVar16;
  RuleScanRecord *local_38;
  
  if (inputRuleInfo->state != IsScanning) {
    __assert_fail("inputRuleInfo.isScanning()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x2b3,
                  "void (anonymous namespace)::BuildEngineImpl::finishScanRequest(RuleInfo &, RuleInfo::StateKind)"
                 );
  }
  __nodes_to_add = inputRuleInfo;
  pRVar11 = RuleInfo::getPendingScanRecord(inputRuleInfo);
  pRVar1 = (RuleInfo *)
           (pRVar11->deferredScanRequests).
           super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar16 = (RuleInfo *)
                 (pRVar11->deferredScanRequests).
                 super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                 ._M_impl.super__Vector_impl_data._M_start; pRVar16 != pRVar1;
      pRVar16 = (RuleInfo *)
                &(pRVar16->result).value.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
    __nodes_to_add = pRVar16;
    std::
    vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
    ::push_back(&this->ruleInfosToScan,(value_type *)pRVar16);
  }
  std::mutex::lock(&this->inputRequestsMutex);
  pTVar15 = (pRVar11->pausedInputRequests).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (pRVar11->pausedInputRequests).
           super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pTVar15 == pTVar2) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->inputRequestsMutex);
      if ((ulong)((long)(this->freeRuleScanRecords).
                        super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->freeRuleScanRecords).
                        super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <
          this->maximumFreeRuleScanRecords) {
        pTVar15 = (pRVar11->pausedInputRequests).
                  super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((pRVar11->pausedInputRequests).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
            ._M_impl.super__Vector_impl_data._M_finish != pTVar15) {
          (pRVar11->pausedInputRequests).
          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ._M_impl.super__Vector_impl_data._M_finish = pTVar15;
        }
        pRVar4 = (pRVar11->deferredScanRequests).
                 super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pRVar11->deferredScanRequests).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
            ._M_impl.super__Vector_impl_data._M_finish != pRVar4) {
          (pRVar11->deferredScanRequests).
          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
          ._M_impl.super__Vector_impl_data._M_finish = pRVar4;
        }
        local_38 = pRVar11;
        std::
        vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
        ::push_back(&this->freeRuleScanRecords,&local_38);
      }
      (inputRuleInfo->inProgressInfo).pendingScanRecord = (RuleScanRecord *)0x0;
      inputRuleInfo->state = newState;
      return;
    }
    pTVar14 = (this->inputRequests).
              super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pTVar14 ==
        (this->inputRequests).
        super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      sVar12 = std::
               deque<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
               ::size(&this->inputRequests);
      if (sVar12 == 0x3ffffffffffffff) {
        std::__throw_length_error("cannot create std::deque larger than max_size()");
      }
      std::
      deque<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
      ::_M_reserve_map_at_back(&this->inputRequests,(size_type)__nodes_to_add);
      pTVar13 = (TaskInputRequest *)operator_new(0x200);
      (this->inputRequests).
      super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node[1] = pTVar13;
      pTVar14 = (this->inputRequests).
                super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      uVar6 = pTVar15->inputID;
      pRVar16 = pTVar15->inputRuleInfo;
      bVar7 = pTVar15->orderOnly;
      bVar8 = pTVar15->forcePriorValue;
      bVar9 = pTVar15->singleUse;
      uVar10 = *(undefined5 *)&pTVar15->field_0x1b;
      pTVar14->taskInfo = pTVar15->taskInfo;
      pTVar14->inputID = uVar6;
      pTVar14->inputRuleInfo = pRVar16;
      pTVar14->orderOnly = bVar7;
      pTVar14->forcePriorValue = bVar8;
      pTVar14->singleUse = bVar9;
      *(undefined5 *)&pTVar14->field_0x1b = uVar10;
      ppTVar3 = (this->inputRequests).
                super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      (this->inputRequests).
      super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = ppTVar3 + 1;
      pTVar14 = ppTVar3[1];
      (this->inputRequests).
      super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first = pTVar14;
      (this->inputRequests).
      super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last = pTVar14 + 0x10;
    }
    else {
      pTVar5 = pTVar15->taskInfo;
      uVar6 = pTVar15->inputID;
      bVar7 = pTVar15->orderOnly;
      bVar8 = pTVar15->forcePriorValue;
      bVar9 = pTVar15->singleUse;
      uVar10 = *(undefined5 *)&pTVar15->field_0x1b;
      pTVar14->inputRuleInfo = pTVar15->inputRuleInfo;
      pTVar14->orderOnly = bVar7;
      pTVar14->forcePriorValue = bVar8;
      pTVar14->singleUse = bVar9;
      *(undefined5 *)&pTVar14->field_0x1b = uVar10;
      pTVar14->taskInfo = pTVar5;
      pTVar14->inputID = uVar6;
      pTVar14 = (this->inputRequests).
                super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    (this->inputRequests).
    super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = pTVar14;
    pTVar15 = pTVar15 + 1;
  } while( true );
}

Assistant:

bool isScanning() const {
      return state == StateKind::IsScanning;
    }